

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffgtcl(fitsfile *fptr,int colnum,int *typecode,long *repeat,long *width,int *status)

{
  int iVar1;
  LONGLONG twidth;
  LONGLONG trepeat;
  long local_28;
  long local_20;
  
  ffgtclll(fptr,colnum,typecode,&local_20,&local_28,status);
  iVar1 = *status;
  if (iVar1 < 1) {
    if (repeat != (long *)0x0) {
      *repeat = local_20;
    }
    if (width != (long *)0x0) {
      *width = local_28;
    }
  }
  return iVar1;
}

Assistant:

int ffgtcl( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - column number                           */
            int *typecode,   /* O - datatype code (21 = short, etc)         */
            long *repeat,    /* O - repeat count of field                   */
            long *width,     /* O - if ASCII, width of field or unit string */
            int  *status)    /* IO - error status                           */
/*
  Get Type of table column. 
  Returns the datatype code of the column, as well as the vector
  repeat count and (if it is an ASCII character column) the
  width of the field or a unit string within the field.  This supports the
  TFORMn = 'rAw' syntax for specifying arrays of substrings, so
  if TFORMn = '60A12' then repeat = 60 and width = 12.
*/
{
    LONGLONG trepeat, twidth;
    
    ffgtclll(fptr, colnum, typecode, &trepeat, &twidth, status);

    if (*status > 0)
        return(*status);
	
    if (repeat)
        *repeat= (long) trepeat;
      
    if (width)
        *width = (long) twidth;
    
    return(*status);
}